

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseMemoryInstrVar<wabt::MemoryVarExpr<(wabt::ExprType)32>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Location loc_00;
  bool bVar2;
  Result RVar3;
  MemoryVarExpr<(wabt::ExprType)32> *pMVar4;
  Enum EVar5;
  Var *this_00;
  Var var;
  Var memidx;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_198);
  Var::Var(&local_1e0);
  bVar2 = PeekMatchLpar(this,Memory);
  if (bVar2) {
    if ((this->options_->features).multi_memory_enabled_ == false) {
      Error(this,0x1f71a0);
      EVar5 = Error;
      goto LAB_0019dce9;
    }
    loc_00.filename._M_len._4_4_ = loc.filename._M_len._4_4_;
    loc_00.filename._M_len._0_4_ = (undefined4)loc.filename._M_len;
    loc_00.filename._M_str._0_4_ = loc.filename._M_str._0_4_;
    loc_00.filename._M_str._4_4_ = loc.filename._M_str._4_4_;
    loc_00.field_1.field_0.line = loc.field_1.field_0.line;
    loc_00.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_00.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_00.field_1._12_4_ = loc.field_1._12_4_;
    RVar3 = ParseMemidx(this,loc_00,&local_198);
    EVar5 = Error;
    if (RVar3.enum_ == Error) goto LAB_0019dce9;
    RVar3 = ParseVar(this,&local_1e0);
    if (RVar3.enum_ == Error) goto LAB_0019dce9;
    pMVar4 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
    Var::Var(&local_c0,&local_198);
    MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr(pMVar4,&local_1e0,&local_c0,&loc);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pMVar4;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
    }
    this_00 = &local_c0;
  }
  else {
    RVar3 = ParseVar(this,&local_198);
    EVar5 = Error;
    if (RVar3.enum_ == Error) goto LAB_0019dce9;
    Var::Var(&local_78,0,&loc);
    bVar2 = ParseVarOpt(this,&local_1e0,&local_78);
    Var::~Var(&local_78);
    if (bVar2) {
      if ((this->options_->features).multi_memory_enabled_ == false) {
        Error(this,0x1f86ed);
        goto LAB_0019dce9;
      }
      pMVar4 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
      Var::Var(&local_108,&local_198);
      MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr(pMVar4,&local_1e0,&local_108,&loc);
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pMVar4;
      if (pEVar1 != (Expr *)0x0) {
        (*pEVar1->_vptr_Expr[1])();
      }
      this_00 = &local_108;
    }
    else {
      pMVar4 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
      Var::Var(&local_150,&local_1e0);
      MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr(pMVar4,&local_198,&local_150,&loc);
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pMVar4;
      if (pEVar1 != (Expr *)0x0) {
        (*pEVar1->_vptr_Expr[1])();
      }
      this_00 = &local_150;
    }
  }
  Var::~Var(this_00);
  EVar5 = Ok;
LAB_0019dce9:
  Var::~Var(&local_1e0);
  Var::~Var(&local_198);
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseMemoryInstrVar(Location loc,
                                       std::unique_ptr<Expr>* out_expr) {
  Var memidx;
  Var var;
  if (PeekMatchLpar(TokenType::Memory)) {
    if (!options_->features.multi_memory_enabled()) {
      Error(loc, "Specifying memory variable is not allowed");
      return Result::Error;
    }
    CHECK_RESULT(ParseMemidx(loc, &memidx));
    CHECK_RESULT(ParseVar(&var));
    out_expr->reset(new T(var, memidx, loc));
  } else {
    CHECK_RESULT(ParseVar(&memidx));
    if (ParseVarOpt(&var, Var(0, loc))) {
      if (!options_->features.multi_memory_enabled()) {
        Error(loc, "Specifiying memory variable is not allowed");
        return Result::Error;
      }
      out_expr->reset(new T(var, memidx, loc));
    } else {
      out_expr->reset(new T(memidx, var, loc));
    }
  }
  return Result::Ok;
}